

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldBaseTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFieldBaseTests::TestStringField_ComparisonIsLessThanOrEqualTo::RunImpl
          (TestStringField_ComparisonIsLessThanOrEqualTo *this)

{
  TestResults *pTVar1;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_148 [2];
  TestDetails local_108 [2];
  TestDetails local_c8;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  StringField stringField;
  TestStringField_ComparisonIsLessThanOrEqualTo *this_local;
  
  stringField.super_FieldBase.m_metrics._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"string",&local_91);
  FIX::StringField::StringField((StringField *)local_70,1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  bVar2 = FIX::operator<=((StringField *)local_70,"string");
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_c8,*ppTVar4,0x4b);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_c8,"stringField <= \"string\"");
  }
  bVar2 = FIX::operator<=((StringField *)local_70,"string_long");
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_108,*ppTVar4,0x4c);
    UnitTest::TestResults::OnTestFailure(pTVar1,local_108,"stringField <= \"string_long\"");
  }
  bVar2 = FIX::operator<=((StringField *)local_70,"str");
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_148,*ppTVar4,0x4d);
    UnitTest::TestResults::OnTestFailure(pTVar1,local_148,"!(stringField <= \"str\")");
  }
  FIX::StringField::~StringField((StringField *)local_70);
  return;
}

Assistant:

TEST(StringField_ComparisonIsLessThanOrEqualTo){
  StringField stringField(1, "string");
  CHECK(stringField <= "string");
  CHECK(stringField <= "string_long");
  CHECK(!(stringField <= "str"));
}